

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messages.pb.cc
# Opt level: O2

char * __thiscall
Messages::Person_PhoneNumber::_InternalParse(Person_PhoneNumber *this,char *ptr,ParseContext *ctx)

{
  ulong uVar1;
  bool bVar2;
  string *s;
  uint64 uVar3;
  ulong uVar4;
  UnknownFieldSet *pUVar5;
  char *local_40;
  uint32 tag;
  
  local_40 = ptr;
  do {
    while( true ) {
      bVar2 = google::protobuf::internal::ParseContext::Done(ctx,&local_40);
      if (bVar2) {
        return local_40;
      }
      local_40 = google::protobuf::internal::ReadTag(local_40,&tag,0);
      if (local_40 == (char *)0x0) {
        return (char *)0x0;
      }
      uVar4 = (ulong)tag;
      if (tag >> 3 != 2) break;
      if ((char)tag == '\x10') {
        uVar3 = google::protobuf::internal::ReadVarint64(&local_40);
        if (local_40 == (char *)0x0) {
          return (char *)0x0;
        }
        if ((Person_PhoneType)uVar3 < (Person_PhoneType_WORK|Person_PhoneType_HOME)) {
          _internal_set_type(this,(Person_PhoneType)uVar3);
        }
        else {
          pUVar5 = mutable_unknown_fields(this);
          google::protobuf::UnknownFieldSet::AddVarint((int)pUVar5,2);
        }
      }
      else {
LAB_00108ce3:
        if ((uVar4 == 0) || ((tag & 7) == 4)) {
          *(uint32 *)&ctx->field_0x50 = tag - 1;
          return local_40;
        }
        uVar1 = *(ulong *)&this->field_0x8;
        if ((uVar1 & 1) == 0) {
          pUVar5 = google::protobuf::internal::InternalMetadata::
                   mutable_unknown_fields_slow<google::protobuf::UnknownFieldSet>
                             ((InternalMetadata *)&this->field_0x8);
        }
        else {
          pUVar5 = (UnknownFieldSet *)((uVar1 & 0xfffffffffffffffe) + 8);
        }
        local_40 = (char *)google::protobuf::internal::UnknownFieldParse(uVar4,pUVar5,local_40,ctx);
        if (local_40 == (char *)0x0) {
          return (char *)0x0;
        }
      }
    }
    if ((tag >> 3 != 1) || ((char)tag != '\n')) goto LAB_00108ce3;
    s = _internal_mutable_number_abi_cxx11_(this);
    local_40 = (char *)google::protobuf::internal::InlineGreedyStringParser
                                 ((string *)s,local_40,ctx);
    google::protobuf::internal::VerifyUTF8(s,"Messages.Person.PhoneNumber.number");
    if (local_40 == (char *)0x0) {
      return (char *)0x0;
    }
  } while( true );
}

Assistant:

const char* Person_PhoneNumber::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  _Internal::HasBits has_bits{};
  ::PROTOBUF_NAMESPACE_ID::Arena* arena = GetArena(); (void)arena;
  while (!ctx->Done(&ptr)) {
    ::PROTOBUF_NAMESPACE_ID::uint32 tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    CHK_(ptr);
    switch (tag >> 3) {
      // required string number = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 10)) {
          auto str = _internal_mutable_number();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          #ifndef NDEBUG
          ::PROTOBUF_NAMESPACE_ID::internal::VerifyUTF8(str, "Messages.Person.PhoneNumber.number");
          #endif  // !NDEBUG
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional .Messages.Person.PhoneType type = 2 [default = HOME];
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 16)) {
          ::PROTOBUF_NAMESPACE_ID::uint64 val = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr);
          CHK_(ptr);
          if (PROTOBUF_PREDICT_TRUE(::Messages::Person_PhoneType_IsValid(val))) {
            _internal_set_type(static_cast<::Messages::Person_PhoneType>(val));
          } else {
            ::PROTOBUF_NAMESPACE_ID::internal::WriteVarint(2, val, mutable_unknown_fields());
          }
        } else goto handle_unusual;
        continue;
      default: {
      handle_unusual:
        if ((tag & 7) == 4 || tag == 0) {
          ctx->SetLastTag(tag);
          goto success;
        }
        ptr = UnknownFieldParse(tag,
            _internal_metadata_.mutable_unknown_fields<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>(),
            ptr, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
    }  // switch
  }  // while
success:
  _has_bits_.Or(has_bits);
  return ptr;
failure:
  ptr = nullptr;
  goto success;
#undef CHK_
}